

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expansion.cpp
# Opt level: O2

void expand_(PadParseMessageBlock *m,int pad_parse_block_count,ExpansionBlock *ws,int *ws_count)

{
  _WordT *p_Var1;
  _WordT *p_Var2;
  _WordT *p_Var3;
  ulong uVar4;
  ExpansionBlock EVar5;
  ExpansionBlock EVar6;
  ExpansionBlock EVar7;
  ExpansionBlock EVar8;
  ExpansionBlock EVar9;
  ExpansionBlock EVar10;
  int i;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  ExpansionBlock *pEVar14;
  long lVar15;
  long lVar16;
  ExpansionBlock eb;
  ExpansionBlock *local_c8;
  reference local_88;
  PadParseMessageBlock mi;
  
  *ws_count = pad_parse_block_count << 6;
  eb.super__Base_bitset<1UL>._M_w = (_Base_bitset<1UL>)0;
  uVar13 = 0;
  uVar12 = (ulong)(uint)pad_parse_block_count;
  if (pad_parse_block_count < 1) {
    uVar12 = uVar13;
  }
  local_c8 = ws + 0x10;
  pEVar14 = ws;
  for (; uVar13 != uVar12; uVar13 = uVar13 + 1) {
    uVar4 = (ulong)((uint)uVar13 & 0x3ffffff);
    p_Var1 = m[uVar13].super__Base_bitset<8UL>._M_w + 2;
    p_Var2 = m[uVar13].super__Base_bitset<8UL>._M_w + 4;
    p_Var3 = m[uVar13].super__Base_bitset<8UL>._M_w + 6;
    mi.super__Base_bitset<8UL>._M_w[6] = *p_Var3;
    mi.super__Base_bitset<8UL>._M_w[7] = p_Var3[1];
    mi.super__Base_bitset<8UL>._M_w[4] = *p_Var2;
    mi.super__Base_bitset<8UL>._M_w[5] = p_Var2[1];
    mi.super__Base_bitset<8UL>._M_w[2] = *p_Var1;
    mi.super__Base_bitset<8UL>._M_w[3] = p_Var1[1];
    mi.super__Base_bitset<8UL>._M_w[0] = m[uVar13].super__Base_bitset<8UL>._M_w[0];
    mi.super__Base_bitset<8UL>._M_w[1] = m[uVar13].super__Base_bitset<8UL>._M_w[1];
    lVar15 = 0x1ff;
    for (lVar16 = 0; lVar16 != 0x10; lVar16 = lVar16 + 1) {
      for (lVar11 = 0; lVar11 != -0x20; lVar11 = lVar11 + -1) {
        local_88._M_bpos = lVar11 + 0x1f;
        local_88._M_wp = (_WordT *)&eb;
        std::bitset<32UL>::reference::operator=
                  (&local_88,
                   (mi.super__Base_bitset<8UL>._M_w[(ulong)(lVar15 + lVar11) >> 6] >>
                    (lVar15 + lVar11 & 0x3fU) & 1) != 0);
      }
      ws[uVar13 + lVar16].super__Base_bitset<1UL>._M_w = (_WordT)eb.super__Base_bitset<1UL>._M_w;
      lVar15 = lVar15 + -0x20;
    }
    for (lVar15 = 0; lVar15 != 0x30; lVar15 = lVar15 + 1) {
      EVar5 = rot(0x11,(ExpansionBlock)ws[uVar4 * 0x40 + lVar15 + 4].super__Base_bitset<1UL>._M_w);
      EVar6 = rot(0xe,(ExpansionBlock)ws[uVar4 * 0x40 + lVar15 + 4].super__Base_bitset<1UL>._M_w);
      EVar7 = shf(0xc,(ExpansionBlock)ws[uVar4 * 0x40 + lVar15 + 4].super__Base_bitset<1UL>._M_w);
      EVar8 = rot(9,(ExpansionBlock)ws[uVar4 * 0x40 + lVar15 + 0xf].super__Base_bitset<1UL>._M_w);
      EVar9 = rot(0x13,(ExpansionBlock)ws[uVar4 * 0x40 + lVar15 + 0xf].super__Base_bitset<1UL>._M_w)
      ;
      EVar10 = shf(9,(ExpansionBlock)ws[uVar4 * 0x40 + lVar15 + 0xf].super__Base_bitset<1UL>._M_w);
      eb.super__Base_bitset<1UL>._M_w._0_4_ =
           ((uint)EVar7.super__Base_bitset<1UL>._M_w ^
           (uint)EVar6.super__Base_bitset<1UL>._M_w ^ (uint)EVar5.super__Base_bitset<1UL>._M_w) +
           (int)ws[uVar4 * 0x40 + lVar15 + 10].super__Base_bitset<1UL>._M_w +
           ((uint)EVar10.super__Base_bitset<1UL>._M_w ^
           (uint)EVar9.super__Base_bitset<1UL>._M_w ^ (uint)EVar8.super__Base_bitset<1UL>._M_w) +
           (int)ws[uVar4 * 0x40 + lVar15 + 1].super__Base_bitset<1UL>._M_w;
      eb.super__Base_bitset<1UL>._M_w._4_4_ = 0;
      local_c8[lVar15].super__Base_bitset<1UL>._M_w = (_WordT)eb.super__Base_bitset<1UL>._M_w;
    }
    for (lVar15 = 0; lVar15 != 0x40; lVar15 = lVar15 + 1) {
      EVar5 = permutationBox((ExpansionBlock)pEVar14[lVar15].super__Base_bitset<1UL>._M_w);
      pEVar14[lVar15].super__Base_bitset<1UL>._M_w = (_WordT)EVar5.super__Base_bitset<1UL>._M_w;
    }
    local_c8 = local_c8 + 1;
    pEVar14 = pEVar14 + 1;
  }
  return;
}

Assistant:

void expand_(PadParseMessageBlock *m, int pad_parse_block_count, ExpansionBlock *ws, int &ws_count)
{
    ws_count = 64 * pad_parse_block_count;
    int ws_iterator = 0;
    ExpansionBlock eb, s1, s0;

    for (int j = 0; j < pad_parse_block_count; ++j) {
        PadParseMessageBlock mi = m[j];

        for (int i = 0; i < EXPANSION_CHUNK_NUM; i++) { // making first 16 Wt
            for (int j = 0; j < EXPANSION_BLOCK_SIZE; j++) {
                eb[EXPANSION_BLOCK_SIZE - 1 - j] = mi[PAD_PARSE_BLOCK_SIZE - 1 - (i * 32) - j];
            }

            ws[ws_iterator + i] = eb;
        }

        for (int i = 16; i < EXPANSION_BLOCK_COUNT_IN_SET; i++) { // making other 64 Wt
            s0 = rot(17, ws[64 * ws_iterator + i - 12]) ^ rot(14, ws[64 * ws_iterator + i - 12]) ^ shf(12, ws[64 * ws_iterator + i - 12]);
            s1 = rot(9, ws[64 * ws_iterator + i - 1]) ^ rot(19, ws[64 * ws_iterator + i - 1]) ^ shf(9, ws[64 * ws_iterator + i - 1]);
            eb = s1.to_ulong() + ws[64 * ws_iterator + i - 6].to_ulong() + s0.to_ulong() + ws[64 * ws_iterator + i - 15].to_ulong();

            ws[ws_iterator + i] = eb;
        }

        for (int i = 0; i < EXPANSION_BLOCK_COUNT_IN_SET; i++) { // permuting the blocks
            ws[ws_iterator + i] = permutationBox(ws[ws_iterator + i]);
        }

        ws_iterator++;
    }
}